

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::CombinePsbt(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::PsbtListStruct_&)> local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::function<cfd::js::api::PsbtOutputDataStruct(cfd::js::api::PsbtListStruct_const&)>::
  function<cfd::js::api::PsbtOutputDataStruct(&)(cfd::js::api::PsbtListStruct_const&),void>
            ((function<cfd::js::api::PsbtOutputDataStruct(cfd::js::api::PsbtListStruct_const&)> *)
             &local_38,PsbtStructApi::CombinePsbt);
  ExecuteJsonApi<cfd::js::api::json::PsbtList,cfd::js::api::json::PsbtOutputData,cfd::js::api::PsbtListStruct,cfd::js::api::PsbtOutputDataStruct>
            ((json *)this,request_message,&local_38);
  std::function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::PsbtListStruct_&)>::
  ~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::CombinePsbt(const std::string &request_message) {
  return ExecuteJsonApi<
      PsbtList, PsbtOutputData, PsbtListStruct, PsbtOutputDataStruct>(
      request_message, PsbtStructApi::CombinePsbt);
}